

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofConstraint.cpp
# Opt level: O0

void __thiscall
btGeneric6DofConstraint::calculateTransforms
          (btGeneric6DofConstraint *this,btTransform *transA,btTransform *transB)

{
  btRigidBody *pbVar1;
  btTypedConstraint *in_RDI;
  btScalar bVar2;
  btScalar bVar3;
  btScalar miS;
  btScalar miB;
  btScalar miA;
  btGeneric6DofConstraint *in_stack_00000030;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  btTransform *in_stack_ffffffffffffffa0;
  btTransform *in_stack_ffffffffffffffa8;
  btGeneric6DofConstraint *in_stack_ffffffffffffffe0;
  
  btTransform::operator*(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  btTransform::operator=
            ((btTransform *)in_RDI,
             (btTransform *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  btTransform::operator*(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  btTransform::operator=
            ((btTransform *)in_RDI,
             (btTransform *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  calculateLinearInfo(in_stack_ffffffffffffffe0);
  calculateAngleInfo(in_stack_00000030);
  if ((in_RDI[0x12].m_needsFeedback & 1U) != 0) {
    pbVar1 = btTypedConstraint::getRigidBodyA(in_RDI);
    bVar2 = btRigidBody::getInvMass(pbVar1);
    pbVar1 = btTypedConstraint::getRigidBodyB(in_RDI);
    bVar3 = btRigidBody::getInvMass(pbVar1);
    *(bool *)&in_RDI[0x12].super_btTypedObject.m_objectType =
         bVar2 < 1.1920929e-07 || bVar3 < 1.1920929e-07;
    if (bVar2 + bVar3 <= 0.0) {
      *(undefined4 *)&in_RDI[0x12]._vptr_btTypedConstraint = 0x3f000000;
    }
    else {
      *(float *)&in_RDI[0x12]._vptr_btTypedConstraint = bVar3 / (bVar2 + bVar3);
    }
    *(float *)((long)&in_RDI[0x12]._vptr_btTypedConstraint + 4) =
         1.0 - *(float *)&in_RDI[0x12]._vptr_btTypedConstraint;
  }
  return;
}

Assistant:

void btGeneric6DofConstraint::calculateTransforms(const btTransform& transA,const btTransform& transB)
{
	m_calculatedTransformA = transA * m_frameInA;
	m_calculatedTransformB = transB * m_frameInB;
	calculateLinearInfo();
	calculateAngleInfo();
	if(m_useOffsetForConstraintFrame)
	{	//  get weight factors depending on masses
		btScalar miA = getRigidBodyA().getInvMass();
		btScalar miB = getRigidBodyB().getInvMass();
		m_hasStaticBody = (miA < SIMD_EPSILON) || (miB < SIMD_EPSILON);
		btScalar miS = miA + miB;
		if(miS > btScalar(0.f))
		{
			m_factA = miB / miS;
		}
		else 
		{
			m_factA = btScalar(0.5f);
		}
		m_factB = btScalar(1.0f) - m_factA;
	}
}